

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

void iter_54(float *z)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar1 = (float)*(undefined8 *)(z + -7);
  fVar2 = (float)((ulong)*(undefined8 *)(z + -7) >> 0x20);
  fVar5 = (float)*(undefined8 *)(z + -3);
  fVar6 = (float)((ulong)*(undefined8 *)(z + -3) >> 0x20);
  fVar9 = fVar5 - fVar1;
  fVar10 = fVar6 - fVar2;
  fVar7 = (float)*(undefined8 *)(z + -1);
  fVar8 = (float)((ulong)*(undefined8 *)(z + -1) >> 0x20);
  fVar3 = (float)*(undefined8 *)(z + -5);
  fVar11 = fVar7 - fVar3;
  fVar4 = (float)((ulong)*(undefined8 *)(z + -5) >> 0x20);
  fVar12 = fVar8 - fVar4;
  fVar7 = fVar7 + fVar3;
  fVar8 = fVar8 + fVar4;
  fVar5 = fVar5 + fVar1;
  fVar6 = fVar6 + fVar2;
  z[-3] = fVar7 - fVar5;
  z[-2] = fVar8 - fVar6;
  z[-1] = fVar5 + fVar7;
  *z = fVar6 + fVar8;
  z[-7] = fVar11 + fVar10;
  z[-6] = fVar12 - fVar9;
  z[-5] = fVar11 - fVar10;
  z[-4] = fVar12 + fVar9;
  return;
}

Assistant:

static __forceinline void iter_54(float *z)
{
   float k00,k11,k22,k33;
   float y0,y1,y2,y3;

   k00  = z[ 0] - z[-4];
   y0   = z[ 0] + z[-4];
   y2   = z[-2] + z[-6];
   k22  = z[-2] - z[-6];

   z[-0] = y0 + y2;      // z0 + z4 + z2 + z6
   z[-2] = y0 - y2;      // z0 + z4 - z2 - z6

   // done with y0,y2

   k33  = z[-3] - z[-7];

   z[-4] = k00 + k33;    // z0 - z4 + z3 - z7
   z[-6] = k00 - k33;    // z0 - z4 - z3 + z7

   // done with k33

   k11  = z[-1] - z[-5];
   y1   = z[-1] + z[-5];
   y3   = z[-3] + z[-7];

   z[-1] = y1 + y3;      // z1 + z5 + z3 + z7
   z[-3] = y1 - y3;      // z1 + z5 - z3 - z7
   z[-5] = k11 - k22;    // z1 - z5 + z2 - z6
   z[-7] = k11 + k22;    // z1 - z5 - z2 + z6
}